

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLJointsLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::JointsLoader::begin__joint(JointsLoader *this,joint__AttributeData *attributeData)

{
  Joint *pJVar1;
  ParserChar *colladaId;
  allocator<char> local_39;
  UniqueId local_38;
  
  pJVar1 = (Joint *)operator_new(0x88);
  IFilePartLoader::createUniqueIdFromId
            (&local_38,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             attributeData->id,JOINT);
  (pJVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>).mUniqueId.mFileId =
       local_38.mFileId;
  (pJVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>).mUniqueId.mClassId =
       local_38.mClassId;
  *(undefined4 *)
   &(pJVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>).mUniqueId.field_0x4 =
       local_38._4_4_;
  (pJVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>).mUniqueId.mObjectId =
       local_38.mObjectId;
  (pJVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>).super_Object._vptr_Object =
       (_func_int **)&PTR__Joint_00908c88;
  (pJVar1->mOriginalId)._M_dataplus._M_p = (pointer)&(pJVar1->mOriginalId).field_2;
  (pJVar1->mOriginalId)._M_string_length = 0;
  (pJVar1->mOriginalId).field_2._M_local_buf[0] = '\0';
  (pJVar1->mName)._M_dataplus._M_p = (pointer)&(pJVar1->mName).field_2;
  (pJVar1->mName)._M_string_length = 0;
  (pJVar1->mName).field_2._M_local_buf[0] = '\0';
  (pJVar1->mJointPrimitives).super_ArrayPrimitiveType<COLLADAFW::JointPrimitive_*>.mData =
       (JointPrimitive **)0x0;
  (pJVar1->mJointPrimitives).super_ArrayPrimitiveType<COLLADAFW::JointPrimitive_*>.mCount = 0;
  (pJVar1->mJointPrimitives).super_ArrayPrimitiveType<COLLADAFW::JointPrimitive_*>.mCapacity = 0;
  (pJVar1->mJointPrimitives).super_ArrayPrimitiveType<COLLADAFW::JointPrimitive_*>.mFlags = 3;
  (pJVar1->mJointPrimitives)._vptr_PointerArray = (_func_int **)&PTR__PointerArray_00908d18;
  this->mCurrentJoint = pJVar1;
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  if (attributeData->name == (char *)0x0) {
    if (attributeData->id != (char *)0x0) {
      pJVar1 = this->mCurrentJoint;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,attributeData->id,&local_39);
      std::__cxx11::string::_M_assign((string *)&pJVar1->mName);
      goto LAB_007ff4ec;
    }
  }
  else {
    pJVar1 = this->mCurrentJoint;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->name,&local_39);
    std::__cxx11::string::_M_assign((string *)&pJVar1->mName);
LAB_007ff4ec:
    if ((FileId *)local_38._0_8_ != &local_38.mFileId) {
      operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
    }
    if (attributeData->id != (char *)0x0) {
      pJVar1 = this->mCurrentJoint;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,attributeData->id,&local_39);
      std::__cxx11::string::_M_assign((string *)&pJVar1->mOriginalId);
      if ((FileId *)local_38._0_8_ != &local_38.mFileId) {
        operator_delete((void *)local_38._0_8_,local_38.mFileId + 1);
      }
      colladaId = attributeData->id;
      goto LAB_007ff555;
    }
  }
  colladaId = (char *)0x0;
LAB_007ff555:
  IFilePartLoader::addToSidTree
            (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             colladaId,attributeData->sid,(Object *)this->mCurrentJoint);
  return true;
}

Assistant:

bool JointsLoader::begin__joint( const joint__AttributeData& attributeData )
	{
		mCurrentJoint = FW_NEW COLLADAFW::Joint( getHandlingFilePartLoader()->createUniqueIdFromId( attributeData.id, COLLADAFW::Joint::ID()) );
		if ( attributeData.name )
		{
			mCurrentJoint->setName(attributeData.name);
		}
		else if ( attributeData.id )
		{
			mCurrentJoint->setName(attributeData.id);
		}

		if ( attributeData.id )
		{
			mCurrentJoint->setOriginalId(attributeData.id);
		}
		getHandlingFilePartLoader()->addToSidTree( attributeData.id, attributeData.sid, mCurrentJoint);
		return true;
	}